

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O2

bool gflags::AppendFlagsIntoFile(string *filename,char *prog_name)

{
  FILE *__stream;
  pointer pCVar1;
  int iVar2;
  int iVar3;
  vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_> *extraout_RDX;
  vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_> *extraout_RDX_00
  ;
  vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_> *extraout_RDX_01
  ;
  vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_> *flags_00;
  const_iterator __position;
  FILE *fp;
  vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_> flags;
  FILE *local_60;
  vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_> local_58;
  string local_40;
  
  iVar2 = SafeFOpen((FILE **)&local_60,(filename->_M_dataplus)._M_p,"a");
  if (iVar2 == 0) {
    if (prog_name != (char *)0x0) {
      fprintf(local_60,"%s\n",prog_name);
    }
    local_58.
    super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>.
    _M_impl.super__Vector_impl_data._M_start = (CommandLineFlagInfo *)0x0;
    local_58.
    super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>.
    _M_impl.super__Vector_impl_data._M_finish = (CommandLineFlagInfo *)0x0;
    local_58.
    super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetAllFlags(&local_58);
    pCVar1 = local_58.
             super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    flags_00 = extraout_RDX;
    for (__position._M_current =
              local_58.
              super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>
              ._M_impl.super__Vector_impl_data._M_start; __position._M_current != pCVar1;
        __position._M_current = __position._M_current + 1) {
      iVar3 = strcmp(((__position._M_current)->name)._M_dataplus._M_p,"flagfile");
      if (iVar3 == 0) {
        std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>::
        erase(&local_58,__position);
        flags_00 = extraout_RDX_01;
        break;
      }
      flags_00 = extraout_RDX_00;
    }
    __stream = local_60;
    TheseCommandlineFlagsIntoString_abi_cxx11_(&local_40,(gflags *)&local_58,flags_00);
    fputs(local_40._M_dataplus._M_p,__stream);
    std::__cxx11::string::~string((string *)&local_40);
    fclose(local_60);
    std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>::~vector
              (&local_58);
  }
  return iVar2 == 0;
}

Assistant:

bool AppendFlagsIntoFile(const string& filename, const char *prog_name) {
  FILE *fp;
  if (SafeFOpen(&fp, filename.c_str(), "a") != 0) {
    return false;
  }

  if (prog_name)
    fprintf(fp, "%s\n", prog_name);

  vector<CommandLineFlagInfo> flags;
  GetAllFlags(&flags);
  // But we don't want --flagfile, which leads to weird recursion issues
  vector<CommandLineFlagInfo>::iterator i;
  for (i = flags.begin(); i != flags.end(); ++i) {
    if (strcmp(i->name.c_str(), "flagfile") == 0) {
      flags.erase(i);
      break;
    }
  }
  fprintf(fp, "%s", TheseCommandlineFlagsIntoString(flags).c_str());

  fclose(fp);
  return true;
}